

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *this;
  TPZFMatrix<double> *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  int in_EDI;
  TPZFMatrix<double> *in_R8;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFMatrix<double> *in_stack_00000578;
  TPZFMatrix<double> *in_stack_00000580;
  int in_stack_0000058c;
  TPZVec<double> *in_stack_00000590;
  
  if ((in_EDI < 4) || (8 < in_EDI)) {
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  if (in_EDI - 4U < 4) {
    TPZShapeLinear::ShapeInternal(in_RSI,in_EDX,in_RCX,in_R8);
  }
  else if (in_EDI == 8) {
    ShapeInternal(in_stack_00000590,in_stack_0000058c,in_stack_00000580,in_stack_00000578);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"Wrong side parameter");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  return;
}

Assistant:

void TPZShapeQuad::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        if (side < 4 || side > 8) {
            DebugStop();
        }
        
        switch (side) {

            case 4:
            case 5:
            case 6:
            case 7:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 8:
            {
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
            LOGPZ_ERROR(logger,"Wrong side parameter")
                DebugStop();
                break;
        }
      
        
      
    }